

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BlitDefaultFramebufferCase::render
          (BlitDefaultFramebufferCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int i;
  deUint32 dVar1;
  deUint32 program;
  deUint32 framebuffer;
  int iVar2;
  int iVar3;
  int dstY1;
  TextureFormat texFormat;
  TransferFormat TVar4;
  long lVar5;
  Context *pCVar6;
  int i_1;
  deUint32 tex;
  DataTypes local_368;
  Vec4 local_348;
  deUint32 fbo;
  float afStack_330 [2];
  Surface *local_328;
  GradientShader gradShader;
  Texture2DShader texShader;
  
  texFormat = glu::mapGLInternalFormat(this->m_format);
  TVar4 = glu::getTransferFormat(texFormat);
  FboTestUtil::GradientShader::GradientShader(&gradShader,TYPE_FLOAT_VEC4);
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (DataType *)0x0;
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (DataType *)0x0;
  local_348.m_data[0] = (float)glu::getSampler2DType(texFormat);
  if (local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::DataType,std::allocator<glu::DataType>>::
    _M_realloc_insert<glu::DataType_const&>
              ((vector<glu::DataType,std::allocator<glu::DataType>> *)&local_368,
               (iterator)
               local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
               _M_impl.super__Vector_impl_data._M_finish,(DataType *)&local_348);
  }
  else {
    *local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
     super__Vector_impl_data._M_finish = (DataType)local_348.m_data[0];
    local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  lVar5 = 0;
  do {
    local_348.m_data[lVar5] = 1.0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  _fbo = 0;
  afStack_330[0] = 0.0;
  afStack_330[1] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texShader,&local_368,TYPE_FLOAT_VEC4,&local_348,(Vec4 *)&fbo);
  if (local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_368.vec.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.vec.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  local_328 = dst;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar1 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&gradShader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar6->_vptr_Context[0x75])(pCVar6,&texShader);
  _fbo = _fbo & 0xffffffff00000000;
  tex = 0;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = 0;
  do {
    local_348.m_data[lVar5] = 1.0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  FboTestUtil::GradientShader::setGradient(&gradShader,pCVar6,dVar1,(Vec4 *)&local_368,&local_348);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar6,program);
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,this->m_filter);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,this->m_filter);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,this->m_format,0x80,0x80,0,TVar4.format,TVar4.dataType,(void *)0x0);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,tex,0);
  FboTestCase::checkError(&this->super_FboTestCase);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  framebuffer = (*((this->super_FboTestCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[6])();
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,framebuffer);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_368.vec.
                        super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_348.m_data._0_8_ = &DAT_3f8000003f800000;
  local_348.m_data[2] = 0.0;
  sglr::drawQuad(pCVar6,dVar1,(Vec3 *)&local_368,(Vec3 *)&local_348);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,fbo);
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glBlitFramebuffer
            (this_00,0,0,iVar2,iVar3,0,0,0x80,0x80,0x4000,this->m_filter);
  dVar1 = (*((this->super_FboTestCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [6])();
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,dVar1);
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f800000;
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  sglr::ContextWrapper::glClearBufferfv(this_00,0x1800,0,(float *)&local_368);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
  local_368.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_368.vec.
                        super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_348.m_data[0] = 0.0;
  local_348.m_data[1] = 1.0;
  local_348.m_data[2] = 0.0;
  sglr::drawQuad(pCVar6,program,(Vec3 *)&local_368,(Vec3 *)&local_348);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,fbo);
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  dstY1 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glBlitFramebuffer
            (this_00,0,0,0x80,0x80,iVar2 / 2,0,iVar3,dstY1,0x4000,this->m_filter);
  dVar1 = (*((this->super_FboTestCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [6])();
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,dVar1);
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels(&this->super_FboTestCase,local_328,0,0,iVar2,iVar3);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  return;
}

Assistant:

virtual void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFormat		= glu::mapGLInternalFormat(m_format);
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(colorFormat);
		GradientShader			gradShader		(glu::TYPE_FLOAT_VEC4);
		Texture2DShader			texShader		(DataTypes() << glu::getSampler2DType(colorFormat), glu::TYPE_FLOAT_VEC4);
		deUint32				gradShaderID	= getCurrentContext()->createProgram(&gradShader);
		deUint32				texShaderID		= getCurrentContext()->createProgram(&texShader);
		deUint32				fbo				= 0;
		deUint32				tex				= 0;
		const int				texW			= 128;
		const int				texH			= 128;

		// Setup shaders
		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));
		texShader.setUniforms(*getCurrentContext(), texShaderID);

		// FBO
		glGenFramebuffers(1, &fbo);
		glGenTextures(1, &tex);

		glBindTexture(GL_TEXTURE_2D, tex);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	m_filter);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	m_filter);
		glTexImage2D(GL_TEXTURE_2D, 0, m_format, texW, texH, 0, transferFmt.format, transferFmt.dataType, DE_NULL);

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		// Render gradient to screen.
		glBindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());

		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Blit gradient from screen to fbo.
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo);
		glBlitFramebuffer(0, 0, getWidth(), getHeight(), 0, 0, texW, texH, GL_COLOR_BUFFER_BIT, m_filter);

		// Fill left half of viewport with quad that uses texture.
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
		glClearBufferfv(GL_COLOR, 0, Vec4(1.0f, 0.0f, 0.0f, 1.0f).getPtr());
		sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(0.0f, 1.0f, 0.0f));

		// Blit fbo to right half.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, fbo);
		glBlitFramebuffer(0, 0, texW, texH, getWidth()/2, 0, getWidth(), getHeight(), GL_COLOR_BUFFER_BIT, m_filter);

		glBindFramebuffer(GL_READ_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
		readPixels(dst, 0, 0, getWidth(), getHeight());
	}